

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

char * iraf2str(char *irafstring,int nchar)

{
  int in_ESI;
  char *in_RDI;
  int j;
  int i;
  char *string;
  uint local_28;
  int local_24;
  char *local_8;
  
  local_8 = (char *)calloc((long)(in_ESI + 1),1);
  if (local_8 == (char *)0x0) {
    ffpmsg((char *)0x20792a);
    local_8 = (char *)0x0;
  }
  else {
    local_28 = (uint)(*in_RDI == '\0');
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      local_8[local_24] = in_RDI[(int)local_28];
      local_28 = local_28 + 2;
    }
  }
  return local_8;
}

Assistant:

static char *iraf2str (

char	*irafstring,	/* IRAF 2-byte/character string */
int	nchar)		/* Number of characters in string */
{
    char *string;
    int i, j;

    string = (char *) calloc (nchar+1, 1);
    if (string == NULL) {
	ffpmsg("IRAF2STR Cannot allocate memory for string variable");
	return (NULL);
	}

    /* the chars are in bytes 1, 3, 5, ... if bigendian format (SUN) */
    /* else in bytes 0, 2, 4, ... if little endian format (Alpha)    */

    if (irafstring[0] != 0)
	j = 0;
    else
	j = 1;

    /* Convert appropriate byte of input to output character */
    for (i = 0; i < nchar; i++) {
	string[i] = irafstring[j];
	j = j + 2;
	}

    return (string);
}